

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rst_display_driver.cpp
# Opt level: O1

void __thiscall RstDisplayDriver::display(RstDisplayDriver *this,Document *doc,ostream *output)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  stringstream url_data;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  ulong local_1f0;
  Document *local_1e8;
  ulong local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = doc;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f0 = 0;
  do {
    uVar4 = Document::size();
    if (uVar4 <= local_1f0) {
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_220,local_218);
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return;
    }
    local_200 = (long *)Document::operator[]((ulong)local_1e8);
    uVar2 = (**(code **)(*local_200 + 8))();
    cVar1 = (char)output;
    switch(uVar2) {
    case 7:
      lVar6 = 3;
      pcVar9 = "#) ";
      break;
    case 8:
      lVar6 = 2;
      pcVar9 = "- ";
      break;
    default:
      goto switchD_001241f5_caseD_9;
    case 10:
      lVar6 = 4;
      pcVar9 = "    ";
      break;
    case 0xb:
      std::__ostream_insert<char,std::char_traits<char>>(output,"::",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
      std::ostream::put(cVar1);
      plVar5 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      goto switchD_001241f5_caseD_9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,lVar6);
switchD_001241f5_caseD_9:
    local_1f8 = 0;
    local_1e0 = 0;
    while (uVar4 = Paragraph::size(), local_1e0 < uVar4) {
      plVar5 = (long *)Paragraph::operator[]((ulong)local_200);
      if (plVar5 == (long *)0x0) {
        bVar10 = true;
        lVar6 = 0;
        bVar11 = false;
        bVar12 = false;
      }
      else {
        lVar6 = __dynamic_cast(plVar5,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
        bVar10 = lVar6 == 0;
        lVar6 = __dynamic_cast(plVar5,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
        lVar7 = __dynamic_cast(plVar5,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
        bVar11 = lVar7 != 0;
        lVar7 = __dynamic_cast(plVar5,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
        bVar12 = lVar7 != 0;
      }
      if (bVar10) {
LAB_0012438b:
        lVar7 = (ulong)bVar11 + 1;
        if (lVar6 != 0) {
          lVar7 = 1;
        }
        pcVar9 = "*";
        if (bVar11 != false) {
          pcVar9 = "**";
        }
        if (lVar6 != 0) {
          pcVar9 = "`";
        }
        if ((bVar11 != false || bVar12) || lVar6 != 0) goto LAB_001243ce;
      }
      else {
        iVar3 = (**(code **)(*local_200 + 8))();
        lVar7 = 2;
        pcVar9 = "``";
        if (iVar3 == 0xb) goto LAB_0012438b;
LAB_001243ce:
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,lVar7);
      }
      (**(code **)(*plVar5 + 0x10))(&local_220,plVar5);
      local_1f8 = local_1f8 + local_218;
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      (**(code **)(*plVar5 + 0x10))(&local_220,plVar5);
      std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_220,local_218);
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      if (bVar10) {
LAB_00124473:
        if (lVar6 == 0) {
          pcVar9 = "*";
          if (bVar11 != false) {
            pcVar9 = "**";
          }
          if (bVar12 || bVar11 != false) {
            lVar7 = (ulong)bVar11 + 1;
            goto LAB_0012458e;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(output,"`_",2);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".. _",4);
          (**(code **)(*plVar5 + 0x10))(&local_220,plVar5);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)local_220,local_218);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
          UrlLineElement::url_abi_cxx11_();
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_1d8,local_1d0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8,local_1c8[0] + 1);
          }
          if (local_220 != local_210) {
            operator_delete(local_220,local_210[0] + 1);
          }
        }
      }
      else {
        iVar3 = (**(code **)(*local_200 + 8))();
        lVar7 = 2;
        pcVar9 = "``";
        if (iVar3 == 0xb) goto LAB_00124473;
LAB_0012458e:
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,lVar7);
      }
      local_1e0 = local_1e0 + 1;
    }
    iVar3 = (**(code **)(*local_200 + 8))();
    if (iVar3 == 3) {
      std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
      std::ostream::put(cVar1);
      poVar8 = (ostream *)std::ostream::flush();
      local_220 = local_210;
      std::__cxx11::string::_M_construct((ulong)&local_220,(char)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_220,local_218);
LAB_001246e7:
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
    }
    else {
      if (iVar3 == 2) {
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar8 = (ostream *)std::ostream::flush();
        local_220 = local_210;
        std::__cxx11::string::_M_construct((ulong)&local_220,(char)local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_220,local_218);
        goto LAB_001246e7;
      }
      if (iVar3 == 1) {
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar8 = (ostream *)std::ostream::flush();
        local_220 = local_210;
        std::__cxx11::string::_M_construct((ulong)&local_220,(char)local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_220,local_218);
        goto LAB_001246e7;
      }
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    local_1f0 = local_1f0 + 1;
  } while( true );
}

Assistant:

void RstDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);
	size_t text_len(0);
	stringstream url_data;

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::UList1:
				output << "- ";
				break;
			case Paragraph::Level::OList1:
				output << "#) ";
				break;
			case Paragraph::Level::Quote:
				output << "    ";
				break;
			case Paragraph::Level::Code:
				output << "::" << endl << endl;
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			text_len += l->content().length();
			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`_";
				url_data << ".. _" << l->content() << " : " << url_le->url() << endl;
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << endl << std::string(text_len, '=');
				break;
			case Paragraph::Level::Title2:
				output << endl << std::string(text_len, '-');
				break;
			case Paragraph::Level::Title3:
				output << endl << std::string(text_len, '~');
				break;
			default:
				break;

		}

		text_len = 0;
		output << endl << endl;
	}

	output << url_data.str();
}